

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O3

bool __thiscall QSslConfiguration::operator==(QSslConfiguration *this,QSslConfiguration *other)

{
  QSslConfigurationPrivate *pQVar1;
  QSslConfigurationPrivate *pQVar2;
  long lVar3;
  QSslEllipticCurve *pQVar4;
  QSslEllipticCurve *pQVar5;
  bool bVar6;
  compare_eq_result_container<QList<QSslCertificate>,_QSslCertificate> cVar7;
  compare_eq_result_container<QList<QSslCipher>,_QSslCipher> cVar8;
  compare_eq_result_container<QList<QByteArray>,_QByteArray> cVar9;
  long lVar10;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar6 = true;
  }
  else {
    bVar6 = QSslCertificate::operator==(&pQVar2->peerCertificate,&pQVar1->peerCertificate);
    if ((((bVar6) &&
         (cVar7 = QList<QSslCertificate>::operator==
                            (&((this->d).d.ptr)->peerCertificateChain,
                             &((other->d).d.ptr)->peerCertificateChain), cVar7)) &&
        (cVar7 = QList<QSslCertificate>::operator==
                           (&((this->d).d.ptr)->localCertificateChain,
                            &((other->d).d.ptr)->localCertificateChain), cVar7)) &&
       ((bVar6 = QSslKey::operator==(&((this->d).d.ptr)->privateKey,&((other->d).d.ptr)->privateKey)
        , bVar6 &&
        (bVar6 = QSslCipher::operator==
                           (&((this->d).d.ptr)->sessionCipher,&((other->d).d.ptr)->sessionCipher),
        bVar6)))) {
      pQVar1 = (this->d).d.ptr;
      pQVar2 = (other->d).d.ptr;
      if ((pQVar1->sessionProtocol == pQVar2->sessionProtocol) &&
         ((bVar6 = ::operator==(&pQVar1->preSharedKeyIdentityHint,&pQVar2->preSharedKeyIdentityHint)
          , bVar6 &&
          (cVar8 = QList<QSslCipher>::operator==
                             (&((this->d).d.ptr)->ciphers,&((other->d).d.ptr)->ciphers), cVar8)))) {
        pQVar1 = (this->d).d.ptr;
        pQVar2 = (other->d).d.ptr;
        lVar3 = (pQVar1->ellipticCurves).d.size;
        if (lVar3 == (pQVar2->ellipticCurves).d.size) {
          pQVar4 = (pQVar1->ellipticCurves).d.ptr;
          pQVar5 = (pQVar2->ellipticCurves).d.ptr;
          if ((pQVar4 != pQVar5) && (lVar3 != 0)) {
            lVar10 = 0;
            do {
              if (*(int *)((long)&pQVar4->id + lVar10) != *(int *)((long)&pQVar5->id + lVar10))
              goto LAB_002459af;
              lVar10 = lVar10 + 4;
            } while (lVar3 << 2 != lVar10);
          }
          bVar6 = QSslKey::operator==(&pQVar1->ephemeralServerKey,&pQVar2->ephemeralServerKey);
          if (((bVar6) &&
              (bVar6 = QSslDiffieHellmanParameters::isEqual
                                 (&((this->d).d.ptr)->dhParams,&((other->d).d.ptr)->dhParams), bVar6
              )) && (cVar7 = QList<QSslCertificate>::operator==
                                       (&((this->d).d.ptr)->caCertificates,
                                        &((other->d).d.ptr)->caCertificates), cVar7)) {
            pQVar1 = (this->d).d.ptr;
            pQVar2 = (other->d).d.ptr;
            if (((pQVar1->protocol == pQVar2->protocol) &&
                (pQVar1->peerVerifyMode == pQVar2->peerVerifyMode)) &&
               ((pQVar1->peerVerifyDepth == pQVar2->peerVerifyDepth &&
                ((pQVar1->allowRootCertOnDemandLoading == pQVar2->allowRootCertOnDemandLoading &&
                 (bVar6 = comparesEqual<QByteArray,_QVariant,_true>
                                    (&pQVar1->backendConfig,&pQVar2->backendConfig), bVar6)))))) {
              pQVar1 = (this->d).d.ptr;
              pQVar2 = (other->d).d.ptr;
              if (((pQVar1->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                   super_QFlagsStorage<QSsl::SslOption>.i ==
                   (pQVar2->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                   super_QFlagsStorage<QSsl::SslOption>.i) &&
                 (bVar6 = ::operator==(&pQVar1->sslSession,&pQVar2->sslSession), bVar6)) {
                pQVar1 = (this->d).d.ptr;
                pQVar2 = (other->d).d.ptr;
                if (((pQVar1->sslSessionTicketLifeTimeHint == pQVar2->sslSessionTicketLifeTimeHint)
                    && (cVar9 = QList<QByteArray>::operator==
                                          (&pQVar1->nextAllowedProtocols,
                                           &pQVar2->nextAllowedProtocols), cVar9)) &&
                   (bVar6 = ::operator==(&((this->d).d.ptr)->nextNegotiatedProtocol,
                                         &((other->d).d.ptr)->nextNegotiatedProtocol), bVar6)) {
                  pQVar1 = (this->d).d.ptr;
                  pQVar2 = (other->d).d.ptr;
                  if (((pQVar1->nextProtocolNegotiationStatus ==
                        pQVar2->nextProtocolNegotiationStatus) &&
                      (pQVar1->dtlsCookieEnabled == pQVar2->dtlsCookieEnabled)) &&
                     ((pQVar1->ocspStaplingEnabled == pQVar2->ocspStaplingEnabled &&
                      (pQVar1->reportFromCallback == pQVar2->reportFromCallback)))) {
                    return pQVar1->missingCertIsFatal == pQVar2->missingCertIsFatal;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_002459af:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool QSslConfiguration::operator==(const QSslConfiguration &other) const
{
    if (d == other.d)
        return true;
    return d->peerCertificate == other.d->peerCertificate &&
        d->peerCertificateChain == other.d->peerCertificateChain &&
        d->localCertificateChain == other.d->localCertificateChain &&
        d->privateKey == other.d->privateKey &&
        d->sessionCipher == other.d->sessionCipher &&
        d->sessionProtocol == other.d->sessionProtocol &&
        d->preSharedKeyIdentityHint == other.d->preSharedKeyIdentityHint &&
        d->ciphers == other.d->ciphers &&
        d->ellipticCurves == other.d->ellipticCurves &&
        d->ephemeralServerKey == other.d->ephemeralServerKey &&
        d->dhParams == other.d->dhParams &&
        d->caCertificates == other.d->caCertificates &&
        d->protocol == other.d->protocol &&
        d->peerVerifyMode == other.d->peerVerifyMode &&
        d->peerVerifyDepth == other.d->peerVerifyDepth &&
        d->allowRootCertOnDemandLoading == other.d->allowRootCertOnDemandLoading &&
        d->backendConfig == other.d->backendConfig &&
        d->sslOptions == other.d->sslOptions &&
        d->sslSession == other.d->sslSession &&
        d->sslSessionTicketLifeTimeHint == other.d->sslSessionTicketLifeTimeHint &&
        d->nextAllowedProtocols == other.d->nextAllowedProtocols &&
        d->nextNegotiatedProtocol == other.d->nextNegotiatedProtocol &&
        d->nextProtocolNegotiationStatus == other.d->nextProtocolNegotiationStatus &&
        d->dtlsCookieEnabled == other.d->dtlsCookieEnabled &&
        d->ocspStaplingEnabled == other.d->ocspStaplingEnabled &&
        d->reportFromCallback == other.d->reportFromCallback &&
        d->missingCertIsFatal == other.d->missingCertIsFatal;
}